

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

void anon_unknown.dwarf_f7a406::ReportHardwareRand(void)

{
  long lVar1;
  long in_FS_OFFSET;
  LogFlags unaff_retaddr;
  int in_stack_0000000c;
  ConstevalFormatString<0U> in_stack_00000048;
  undefined1 in_stack_00000050 [16];
  undefined1 in_stack_00000060 [16];
  Level in_stack_00000140;
  char *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((anonymous_namespace)::g_rdseed_supported & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffb0 = "Using RdSeed as an additional entropy source\n";
    LogPrintFormatInternal<>
              ((string_view)in_stack_00000060,(string_view)in_stack_00000050,in_stack_0000000c,
               unaff_retaddr,in_stack_00000140,in_stack_00000048);
  }
  if (((anonymous_namespace)::g_rdrand_supported & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    LogPrintFormatInternal<>
              ((string_view)in_stack_00000060,(string_view)in_stack_00000050,in_stack_0000000c,
               unaff_retaddr,in_stack_00000140,in_stack_00000048);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReportHardwareRand()
{
    // This must be done in a separate function, as InitHardwareRand() may be indirectly called
    // from global constructors, before logging is initialized.
    if (g_rdseed_supported) {
        LogPrintf("Using RdSeed as an additional entropy source\n");
    }
    if (g_rdrand_supported) {
        LogPrintf("Using RdRand as an additional entropy source\n");
    }
}